

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::GlobMultiFileList::DynamicFilterPushdown
          (GlobMultiFileList *this,ClientContext *context,MultiFileOptions *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *types,vector<unsigned_long,_true> *column_ids,
          TableFilterSet *filters)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  TableFilterSet *in_stack_00000010;
  idx_t path_index;
  vector<duckdb::OpenFileInfo,_true> file_list;
  _func_int **local_58;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_50;
  vector<duckdb::OpenFileInfo,_true> local_48;
  
  if ((*(char *)((long)&(names->
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1) == '\0') &&
     (*(char *)&(names->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == '\0')) {
    (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
  }
  else {
    __mutex = (pthread_mutex_t *)((long)&(context->config).home_directory.field_2 + 8);
    ::std::mutex::lock((mutex *)&__mutex->__data);
    local_50._M_head_impl =
         (context->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>.
         _M_t.super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
         super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
    ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_48,
               (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
               &context->config);
    do {
      bVar1 = ExpandPathInternal((GlobMultiFileList *)context,(idx_t *)&local_50,&local_48);
    } while (bVar1);
    bVar1 = PushdownInternal((ClientContext *)options,(MultiFileOptions *)names,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)types,(vector<duckdb::LogicalType,_true> *)column_ids,
                             (vector<unsigned_long,_true> *)filters,in_stack_00000010,&local_48);
    if (bVar1) {
      make_uniq<duckdb::SimpleMultiFileList,duckdb::vector<duckdb::OpenFileInfo,true>&>
                ((duckdb *)&local_58,&local_48);
      (this->super_MultiFileList)._vptr_MultiFileList = local_58;
    }
    else {
      (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
    }
    ::std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_48);
    pthread_mutex_unlock(__mutex);
  }
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

unique_ptr<MultiFileList>
GlobMultiFileList::DynamicFilterPushdown(ClientContext &context, const MultiFileOptions &options,
                                         const vector<string> &names, const vector<LogicalType> &types,
                                         const vector<column_t> &column_ids, TableFilterSet &filters) const {
	if (!options.hive_partitioning && !options.filename) {
		return nullptr;
	}
	lock_guard<mutex> lck(lock);

	// Expand all paths into a copy
	// FIXME: lazy expansion and push filters into glob
	idx_t path_index = current_path;
	auto file_list = expanded_files;
	while (ExpandPathInternal(path_index, file_list)) {
	}

	auto res = PushdownInternal(context, options, names, types, column_ids, filters, file_list);
	if (res) {
		return make_uniq<SimpleMultiFileList>(file_list);
	}

	return nullptr;
}